

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::LightBounds::ToString_abi_cxx11_(string *__return_storage_ptr__,LightBounds *this)

{
  bool *in_RAX;
  
  StringPrintf<pbrt::Bounds3<float>const&,pbrt::Vector3<float>const&,float_const&,float_const&,float_const&,float_const&,float_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ LightBounds b: %s w: %s phi: %f theta_o: %f theta_e: %f cosTheta_o: %f cosTheta_e: %f twoSided: %s ]"
             ,(char *)this,(Bounds3<float> *)&this->w,(Vector3<float> *)&this->phi,&this->theta_o,
             &this->theta_e,&this->cosTheta_o,&this->cosTheta_e,(float *)&this->twoSided,in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string LightBounds::ToString() const {
    return StringPrintf("[ LightBounds b: %s w: %s phi: %f theta_o: %f theta_e: %f "
                        "cosTheta_o: %f cosTheta_e: %f twoSided: %s ]",
                        b, w, phi, theta_o, theta_e, cosTheta_o, cosTheta_e, twoSided);
}